

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

QModelIndex * __thiscall
QtMWidgets::PickerPrivate::indexForPos
          (QModelIndex *__return_storage_ptr__,PickerPrivate *this,QPoint *pos)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QRect r;
  QPersistentModelIndex index;
  QPoint local_58;
  int local_50;
  int local_4c;
  QPoint *local_48;
  QPersistentModelIndex *local_40;
  QPersistentModelIndex local_38 [8];
  
  if (-1 < this->itemsCount) {
    iVar5 = this->drawItemOffset;
    local_40 = &this->topItemIndex;
    iVar4 = 0;
    local_48 = pos;
    do {
      lVar1 = *(long *)&this->q->field_0x20;
      local_50 = *(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14);
      local_58.xp = this->itemSideMargin;
      local_4c = iVar5 + -1 + this->stringHeight;
      local_58.yp = iVar5;
      cVar3 = QRect::contains(&local_58,SUB81(pos,0));
      if (cVar3 == '\0') {
        iVar5 = iVar5 + this->stringHeight + this->itemTopMargin;
      }
      else {
        QPersistentModelIndex::QPersistentModelIndex(local_38,local_40);
        for (iVar6 = iVar4; iVar6 != 0; iVar6 = iVar6 + -1) {
          makeNextIndex(this,local_38);
        }
        QPersistentModelIndex::operator_cast_to_QModelIndex(__return_storage_ptr__,local_38);
        QPersistentModelIndex::~QPersistentModelIndex(local_38);
        pos = local_48;
      }
      if (cVar3 != '\0') {
        return __return_storage_ptr__;
      }
      bVar2 = iVar4 < this->itemsCount;
      iVar4 = iVar4 + 1;
    } while (bVar2);
  }
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  __return_storage_ptr__->m = (QAbstractItemModel *)0x0;
  return __return_storage_ptr__;
}

Assistant:

QModelIndex
PickerPrivate::indexForPos( const QPoint & pos )
{
	int offset = drawItemOffset;

	for( int i = 0; i < itemsCount + 1; ++i )
	{
		const QRect r( q->rect().x() + itemSideMargin, offset,
			q->rect().width() - itemSideMargin, stringHeight );

		if( r.contains( pos ) )
		{
			QPersistentModelIndex index = topItemIndex;

			for( int j = 0; j < i; ++j )
				makeNextIndex( index );

			return index;
		}

		offset += stringHeight + itemTopMargin;
	}

	return QModelIndex();
}